

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8d_parser.c
# Opt level: O0

void write_ivf_header(void *hal,RK_U8 *dst)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  long lVar13;
  long lVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  MppEncRcCfg *rc;
  MppEncPrepCfg *prep;
  HalVp8eCtx *ctx;
  RK_U8 data [32];
  RK_U8 *dst_local;
  void *hal_local;
  
  data._24_8_ = dst;
  memset(&ctx,0,0x20);
  lVar13 = *(long *)((long)hal + 0x70);
  lVar14 = *(long *)((long)hal + 0x70);
  uVar1 = *(undefined4 *)(lVar13 + 0xc);
  uVar2 = *(undefined4 *)(lVar13 + 0xc);
  uVar3 = *(undefined4 *)(lVar13 + 0x10);
  uVar4 = *(undefined4 *)(lVar13 + 0x10);
  uVar5 = *(undefined4 *)(lVar14 + 0xb8);
  uVar6 = *(undefined4 *)(lVar14 + 0xb8);
  uVar7 = *(undefined4 *)(lVar14 + 0xb8);
  uVar8 = *(undefined4 *)(lVar14 + 0xb8);
  uVar9 = *(undefined4 *)(lVar14 + 0xbc);
  uVar10 = *(undefined4 *)(lVar14 + 0xbc);
  uVar11 = *(undefined4 *)(lVar14 + 0xbc);
  uVar12 = *(undefined4 *)(lVar14 + 0xbc);
  uVar15 = *(undefined8 *)((long)hal + 0x6918);
  uVar16 = *(undefined8 *)((long)hal + 0x6918);
  uVar17 = *(undefined8 *)((long)hal + 0x6918);
  uVar18 = *(undefined8 *)((long)hal + 0x6918);
  *(ulong *)data._24_8_ = CONCAT17(ctx._7_1_,CONCAT16(0x20,CONCAT24(ctx._4_2_,0x46494b44)));
  *(ulong *)(data._24_8_ + 8) =
       CONCAT17((char)((uint)uVar4 >> 8),
                CONCAT16((char)uVar3,
                         CONCAT15((char)((uint)uVar2 >> 8),CONCAT14((char)uVar1,0x30385056))));
  *(ulong *)(data._24_8_ + 0x10) =
       CONCAT17((char)((uint)uVar12 >> 0x18),
                CONCAT16((char)((uint)uVar11 >> 0x10),
                         CONCAT15((char)((uint)uVar10 >> 8),
                                  CONCAT14((char)uVar9,
                                           CONCAT13((char)((uint)uVar8 >> 0x18),
                                                    CONCAT12((char)((uint)uVar7 >> 0x10),
                                                             CONCAT11((char)((uint)uVar6 >> 8),
                                                                      (char)uVar5)))))));
  *(ulong *)(data._24_8_ + 0x18) =
       CONCAT44(data._20_4_,
                CONCAT13((char)((ulong)uVar18 >> 0x18),
                         CONCAT12((char)((ulong)uVar17 >> 0x10),
                                  CONCAT11((char)((ulong)uVar16 >> 8),(char)uVar15))));
  return;
}

Assistant:

static void write_ivf_header(VP8DParserContext_t *ctx, FILE *fp)
{
    RK_U8 data[IVF_HDR_BYTES] = {0};

    data[0] = 'D';
    data[1] = 'K';
    data[2] = 'I';
    data[3] = 'F';

    data[6] = 32;

    data[8] = 'V';
    data[9] = 'P';
    data[10] = '8';
    data[11] = '0';

    data[12] = ctx->width & 0xff;
    data[13] = (ctx->width >> 8) & 0xff;
    data[14] = ctx->height & 0xff;
    data[15] = (ctx->height >> 8) & 0xff;

    data[16] = 30;
    data[17] = data[18] = data[19] = 0;

    data[20] = 1;
    data[21] = data[22] = data[23] = 0;

    data[24] = data[25] = data[26] = data[27] = 0xff;

    fwrite(data, IVF_HDR_BYTES, 1, fp);
}